

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O2

double TasGrid::Optimizer::getValue<(TasGrid::TypeOneDRule)15>
                 (CurrentNodes<(TasGrid::TypeOneDRule)15> *current,double x)

{
  double dVar1;
  vector<double,_std::allocator<double>_> lag;
  _Vector_base<double,_std::allocator<double>_> local_20;
  
  evalLagrange((vector<double,_std::allocator<double>_> *)&local_20,&current->nodes,&current->coeff,
               x);
  dVar1 = 0.0;
  for (; local_20._M_impl.super__Vector_impl_data._M_start !=
         local_20._M_impl.super__Vector_impl_data._M_finish;
      local_20._M_impl.super__Vector_impl_data._M_start =
           local_20._M_impl.super__Vector_impl_data._M_start + 1) {
    dVar1 = dVar1 + ABS(*local_20._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_20);
  return dVar1;
}

Assistant:

double getValue<rule_maxlebesgue>(CurrentNodes<rule_maxlebesgue> const& current, double x){
    std::vector<double> lag = evalLagrange(current.nodes, current.coeff, x);
    double sum = 0.0;
    for(auto l : lag) sum += std::abs(l);
    return sum;
}